

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O1

UVec3 __thiscall
deqp::gles31::Functional::GlobalInvocationIDCase::computeReference
          (GlobalInvocationIDCase *this,UVec3 *numWorkGroups,UVec3 *workGroupSize,UVec3 *workGroupID
          ,UVec3 *localInvocationID)

{
  Vector<unsigned_int,_3> *res_1;
  long lVar1;
  long in_R9;
  UVec3 UVar2;
  Vector<unsigned_int,_3> res;
  
  res.m_data[2] = 0;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = workGroupID->m_data[lVar1] * localInvocationID->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  *(undefined4 *)
   &(this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  (this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x0;
  lVar1 = 0;
  do {
    UVar2.m_data[2] = *(int *)(in_R9 + lVar1 * 4) + res.m_data[lVar1];
    *(uint *)((long)&(this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.
                     super_TestNode._vptr_TestNode + lVar1 * 4) = UVar2.m_data[2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  UVar2.m_data._0_8_ = this;
  return (UVec3)UVar2.m_data;
}

Assistant:

UVec3 computeReference (const UVec3& numWorkGroups, const UVec3& workGroupSize, const UVec3& workGroupID, const UVec3& localInvocationID) const
	{
		DE_UNREF(numWorkGroups);
		return workGroupID * workGroupSize + localInvocationID;
	}